

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtCompoundCompoundLeafCallback::Process
          (cbtCompoundCompoundLeafCallback *this,cbtDbvtNode *leaf0,cbtDbvtNode *leaf1)

{
  float fVar1;
  float fVar2;
  cbtScalar cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  ulong uVar8;
  uint indexA;
  cbtTransform *pcVar9;
  cbtCollisionShape *pcVar10;
  void *pvVar11;
  cbtCollisionShape *pcVar12;
  cbtCollisionShape *pcVar13;
  cbtManifoldResult *pcVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  byte bVar18;
  bool bVar19;
  int iVar20;
  long lVar21;
  cbtSimplePair *pcVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  CProfileSample __profile;
  cbtCollisionObjectWrapper compoundWrap1;
  cbtCollisionObjectWrapper compoundWrap0;
  cbtVector3 aabbMax1;
  cbtVector3 aabbMin1;
  CProfileSample local_169;
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  float local_150;
  float local_144;
  ulong local_140;
  cbtCollisionObjectWrapper local_138;
  cbtCollisionObjectWrapper local_110;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_d8;
  float local_d4;
  float local_d0;
  cbtTransform local_c8;
  cbtCollisionObjectWrapper *local_88;
  cbtCollisionObjectWrapper *pcStack_80;
  cbtTransform local_70;
  long *plVar23;
  
  CProfileSample::CProfileSample(&local_169,"cbtCompoundCompoundLeafCallback::Process");
  this->m_numOverlapPairs = this->m_numOverlapPairs + 1;
  indexA = (leaf0->field_2).dataAsInt;
  local_140 = (ulong)(leaf1->field_2).dataAsInt;
  pcVar9 = this->m_compound0ColObjWrap->m_worldTransform;
  lVar24 = (long)(int)indexA * 0x58;
  pcVar10 = this->m_compound1ColObjWrap->m_shape;
  lVar21 = local_140 * 0x58;
  pvVar11 = this->m_compound0ColObjWrap->m_shape[1].m_userPointer;
  fVar30 = (pcVar9->m_basis).m_el[0].m_floats[1];
  fVar1 = (pcVar9->m_basis).m_el[1].m_floats[1];
  auVar43._4_4_ = fVar1;
  auVar43._0_4_ = fVar1;
  auVar43._8_4_ = fVar1;
  auVar43._12_4_ = fVar1;
  fVar2 = (pcVar9->m_basis).m_el[2].m_floats[1];
  cVar3 = (pcVar9->m_basis).m_el[0].m_floats[0];
  auVar38._4_4_ = cVar3;
  auVar38._0_4_ = cVar3;
  auVar38._8_4_ = cVar3;
  auVar38._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[1].m_floats[0];
  auVar45._4_4_ = cVar3;
  auVar45._0_4_ = cVar3;
  auVar45._8_4_ = cVar3;
  auVar45._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[2].m_floats[0];
  auVar29._4_4_ = cVar3;
  auVar29._0_4_ = cVar3;
  auVar29._8_4_ = cVar3;
  auVar29._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[0].m_floats[2];
  auVar41._4_4_ = cVar3;
  auVar41._0_4_ = cVar3;
  auVar41._8_4_ = cVar3;
  auVar41._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[1].m_floats[2];
  auVar47._4_4_ = cVar3;
  auVar47._0_4_ = cVar3;
  auVar47._8_4_ = cVar3;
  auVar47._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[2].m_floats[2];
  auVar28._4_4_ = cVar3;
  auVar28._0_4_ = cVar3;
  auVar28._8_4_ = cVar3;
  auVar28._12_4_ = cVar3;
  fVar51 = *(float *)((long)pvVar11 + lVar24 + 0x18);
  uVar4 = *(uint *)((long)pvVar11 + lVar24 + 8);
  uVar5 = *(uint *)((long)pvVar11 + lVar24 + 0x28);
  uVar6 = *(uint *)((long)pvVar11 + lVar24 + 0x38);
  pcVar12 = *(cbtCollisionShape **)((long)pvVar11 + lVar24 + 0x40);
  pcVar13 = *(cbtCollisionShape **)((long)pcVar10[1].m_userPointer + lVar21 + 0x40);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar30)),ZEXT416(uVar4),auVar38);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar1)),ZEXT416(uVar4),auVar45);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar2)),auVar29,ZEXT416(uVar4));
  uVar4 = *(uint *)((long)pvVar11 + lVar24 + 0x30);
  auVar15 = vfmadd231ss_fma(auVar32,ZEXT416(uVar5),auVar41);
  auVar16 = vfmadd231ss_fma(auVar25,ZEXT416(uVar5),auVar47);
  auVar27 = vfmadd231ss_fma(auVar27,auVar28,ZEXT416(uVar5));
  fVar51 = *(float *)((long)pvVar11 + lVar24 + 0x34);
  auVar25 = vmulss_avx512f(auVar43,ZEXT416((uint)fVar51));
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar30)),ZEXT416(uVar4),auVar38);
  auVar26 = vfmadd231ss_avx512f(auVar25,ZEXT416(uVar4),auVar45);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar2)),auVar29,ZEXT416(uVar4));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416(uVar6),auVar41);
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416(uVar6),auVar47);
  auVar26 = vaddss_avx512f(auVar26,ZEXT416((uint)(pcVar9->m_origin).m_floats[1]));
  auVar25 = vfmadd231ss_fma(auVar25,auVar28,ZEXT416(uVar6));
  auVar32 = vinsertps_avx(ZEXT416((uint)(auVar32._0_4_ + (pcVar9->m_origin).m_floats[0])),auVar26,
                          0x10);
  uVar7 = *(undefined8 *)((long)pvVar11 + lVar24 + 0x10);
  local_70.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar32,ZEXT416((uint)(auVar25._0_4_ + (pcVar9->m_origin).m_floats[2])),0x28);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)((long)pvVar11 + lVar24);
  fVar51 = (float)uVar7;
  auVar35._0_4_ = fVar51 * fVar30;
  fVar52 = (float)((ulong)uVar7 >> 0x20);
  auVar35._4_4_ = fVar52 * fVar30;
  auVar35._8_4_ = fVar30 * 0.0;
  auVar35._12_4_ = fVar30 * 0.0;
  auVar26._0_4_ = fVar51 * fVar2;
  auVar26._4_4_ = fVar52 * fVar2;
  auVar26._8_4_ = fVar2 * 0.0;
  auVar26._12_4_ = fVar2 * 0.0;
  auVar32 = vfmadd231ps_fma(auVar35,auVar49,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)((long)pvVar11 + lVar24 + 0x20);
  auVar25 = vfmadd231ps_fma(auVar26,auVar49,auVar29);
  auVar32 = vfmadd231ps_fma(auVar32,auVar39,auVar41);
  auVar25 = vfmadd231ps_fma(auVar25,auVar39,auVar28);
  local_70.m_basis.m_el[0].m_floats._0_8_ = vmovlps_avx(auVar32);
  auVar36._0_4_ = fVar51 * fVar1;
  auVar36._4_4_ = fVar52 * fVar1;
  auVar36._8_4_ = fVar1 * 0.0;
  auVar36._12_4_ = fVar1 * 0.0;
  local_70.m_basis.m_el[0].m_floats[2] = auVar15._0_4_;
  local_70.m_basis.m_el[0].m_floats[3] = 0.0;
  auVar32 = vfmadd231ps_fma(auVar36,auVar49,auVar45);
  auVar32 = vfmadd231ps_fma(auVar32,auVar39,auVar47);
  local_70.m_basis.m_el[1].m_floats._0_8_ = vmovlps_avx(auVar32);
  local_70.m_basis.m_el[1].m_floats[2] = auVar16._0_4_;
  local_70.m_basis.m_el[1].m_floats[3] = 0.0;
  local_70.m_basis.m_el[2].m_floats._0_8_ = vmovlps_avx(auVar25);
  local_70.m_basis.m_el[2].m_floats[2] = auVar27._0_4_;
  local_70.m_basis.m_el[2].m_floats[3] = 0.0;
  pcVar9 = this->m_compound1ColObjWrap->m_worldTransform;
  pvVar11 = pcVar10[1].m_userPointer;
  fVar30 = (pcVar9->m_basis).m_el[0].m_floats[1];
  auVar34._4_4_ = fVar30;
  auVar34._0_4_ = fVar30;
  auVar34._8_4_ = fVar30;
  auVar34._12_4_ = fVar30;
  fVar1 = (pcVar9->m_basis).m_el[1].m_floats[1];
  auVar42._4_4_ = fVar1;
  auVar42._0_4_ = fVar1;
  auVar42._8_4_ = fVar1;
  auVar42._12_4_ = fVar1;
  fVar2 = (pcVar9->m_basis).m_el[2].m_floats[1];
  auVar48._4_4_ = fVar2;
  auVar48._0_4_ = fVar2;
  auVar48._8_4_ = fVar2;
  auVar48._12_4_ = fVar2;
  fVar51 = *(float *)((long)pvVar11 + lVar21 + 0x18);
  cVar3 = (pcVar9->m_basis).m_el[0].m_floats[0];
  auVar37._4_4_ = cVar3;
  auVar37._0_4_ = cVar3;
  auVar37._8_4_ = cVar3;
  auVar37._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[1].m_floats[0];
  auVar44._4_4_ = cVar3;
  auVar44._0_4_ = cVar3;
  auVar44._8_4_ = cVar3;
  auVar44._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[2].m_floats[0];
  auVar33._4_4_ = cVar3;
  auVar33._0_4_ = cVar3;
  auVar33._8_4_ = cVar3;
  auVar33._12_4_ = cVar3;
  uVar4 = *(uint *)((long)pvVar11 + lVar21 + 8);
  cVar3 = (pcVar9->m_basis).m_el[0].m_floats[2];
  auVar40._4_4_ = cVar3;
  auVar40._0_4_ = cVar3;
  auVar40._8_4_ = cVar3;
  auVar40._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[1].m_floats[2];
  auVar46._4_4_ = cVar3;
  auVar46._0_4_ = cVar3;
  auVar46._8_4_ = cVar3;
  auVar46._12_4_ = cVar3;
  cVar3 = (pcVar9->m_basis).m_el[2].m_floats[2];
  auVar31._4_4_ = cVar3;
  auVar31._0_4_ = cVar3;
  auVar31._8_4_ = cVar3;
  auVar31._12_4_ = cVar3;
  uVar5 = *(uint *)((long)pvVar11 + lVar21 + 0x28);
  uVar6 = *(uint *)((long)pvVar11 + lVar21 + 0x38);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar30)),ZEXT416(uVar4),auVar37);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar1)),ZEXT416(uVar4),auVar44);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar51)),auVar33,ZEXT416(uVar4));
  uVar4 = *(uint *)((long)pvVar11 + lVar21 + 0x30);
  auVar15 = vfmadd231ss_fma(auVar32,ZEXT416(uVar5),auVar40);
  auVar16 = vfmadd231ss_fma(auVar25,ZEXT416(uVar5),auVar46);
  auVar26 = vfmadd231ss_fma(auVar27,auVar31,ZEXT416(uVar5));
  fVar1 = *(float *)((long)pvVar11 + lVar21 + 0x34);
  auVar25 = vmulss_avx512f(auVar42,ZEXT416((uint)fVar1));
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar30)),ZEXT416(uVar4),auVar37);
  auVar27 = vfmadd231ss_avx512f(auVar25,ZEXT416(uVar4),auVar44);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar1)),auVar33,ZEXT416(uVar4));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416(uVar6),auVar40);
  auVar27 = vfmadd231ss_avx512f(auVar27,ZEXT416(uVar6),auVar46);
  auVar27 = vaddss_avx512f(auVar27,ZEXT416((uint)(pcVar9->m_origin).m_floats[1]));
  auVar25 = vfmadd231ss_fma(auVar25,auVar31,ZEXT416(uVar6));
  uVar8 = *(ulong *)((long)pvVar11 + lVar21 + 0x10);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)((long)pvVar11 + lVar21 + 0x20);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar8;
  auVar28 = vmulps_avx512vl(auVar34,auVar54);
  auVar29 = vmulps_avx512vl(auVar42,auVar54);
  auVar32 = vinsertps_avx(ZEXT416((uint)(auVar32._0_4_ + (pcVar9->m_origin).m_floats[0])),auVar27,
                          0x10);
  local_c8.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar32,ZEXT416((uint)(auVar25._0_4_ + (pcVar9->m_origin).m_floats[2])),0x28);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)((long)pvVar11 + lVar21);
  auVar32 = vfmadd231ps_fma(auVar28,auVar50,auVar37);
  auVar25 = vfmadd231ps_fma(auVar29,auVar50,auVar44);
  auVar32 = vfmadd231ps_fma(auVar32,auVar53,auVar40);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar8;
  auVar27 = vmulps_avx512vl(auVar48,auVar55);
  auVar25 = vfmadd231ps_fma(auVar25,auVar53,auVar46);
  auVar27 = vfmadd231ps_fma(auVar27,auVar50,auVar33);
  local_c8.m_basis.m_el[0].m_floats._0_8_ = vmovlps_avx(auVar32);
  local_c8.m_basis.m_el[0].m_floats[2] = auVar15._0_4_;
  local_c8.m_basis.m_el[0].m_floats[3] = 0.0;
  local_c8.m_basis.m_el[1].m_floats._0_8_ = vmovlps_avx(auVar25);
  local_c8.m_basis.m_el[1].m_floats[2] = auVar16._0_4_;
  local_c8.m_basis.m_el[1].m_floats[3] = 0.0;
  auVar32 = vfmadd231ps_fma(auVar27,auVar53,auVar31);
  local_c8.m_basis.m_el[2].m_floats._0_8_ = vmovlps_avx(auVar32);
  local_c8.m_basis.m_el[2].m_floats[2] = auVar26._0_4_;
  local_c8.m_basis.m_el[2].m_floats[3] = 0.0;
  (*pcVar12->_vptr_cbtCollisionShape[2])(pcVar12,&local_70,&local_158,&local_168);
  (*pcVar13->_vptr_cbtCollisionShape[2])(pcVar13,&local_c8,&local_d8,&local_e8);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_158;
  fVar30 = this->m_resultOut->m_closestPointDistanceThreshold;
  auVar25._4_4_ = fVar30;
  auVar25._0_4_ = fVar30;
  auVar25._8_4_ = fVar30;
  auVar25._12_4_ = fVar30;
  auVar32 = vsubps_avx(auVar32,auVar25);
  local_158 = vmovlps_avx(auVar32);
  local_150 = local_150 - fVar30;
  auVar27._0_4_ = fVar30 + (float)local_168;
  auVar27._4_4_ = fVar30 + (float)((ulong)local_168 >> 0x20);
  auVar27._8_4_ = fVar30 + 0.0;
  auVar27._12_4_ = fVar30 + 0.0;
  local_168 = vmovlps_avx(auVar27);
  local_160 = fVar30 + local_160;
  fVar30 = auVar32._0_4_;
  if (gCompoundCompoundChildShapePairCallback != (cbtShapePairCallback)0x0) {
    bVar19 = (*gCompoundCompoundChildShapePairCallback)(pcVar12,pcVar13);
    if (!bVar19) goto LAB_008bad89;
    fVar30 = (float)local_158;
  }
  uVar8 = local_140;
  bVar18 = 1;
  if ((fVar30 <= local_e8) && (bVar18 = 1, local_d8 <= (float)local_168)) {
    bVar18 = 0;
  }
  bVar17 = 1;
  if ((local_150 <= local_e0) && (local_d0 <= local_160)) {
    bVar17 = bVar18;
  }
  if ((local_158._4_4_ <= local_e4) && (!(bool)(bVar17 | local_168._4_4_ < local_d4))) {
    local_110.m_parent = this->m_compound0ColObjWrap;
    local_110.m_collisionObject = (local_110.m_parent)->m_collisionObject;
    local_110.m_partId = -1;
    local_138.m_parent = this->m_compound1ColObjWrap;
    local_138.m_collisionObject = (local_138.m_parent)->m_collisionObject;
    local_138.m_partId = -1;
    local_138.m_index = (int)local_140;
    local_138.m_shape = pcVar13;
    local_138.m_worldTransform = &local_c8;
    local_110.m_shape = pcVar12;
    local_110.m_worldTransform = &local_70;
    local_110.m_index = indexA;
    pcVar22 = cbtHashedSimplePairCache::findPair
                        (this->m_childCollisionAlgorithmCache,indexA,local_138.m_index);
    local_144 = this->m_resultOut->m_closestPointDistanceThreshold;
    if (local_144 <= 0.0) {
      if (pcVar22 == (cbtSimplePair *)0x0) {
        iVar20 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                           (this->m_dispatcher,&local_110,&local_138,this->m_sharedManifold,1);
        plVar23 = (long *)CONCAT44(extraout_var_00,iVar20);
        iVar20 = (*this->m_childCollisionAlgorithmCache->_vptr_cbtHashedSimplePairCache[3])
                           (this->m_childCollisionAlgorithmCache,(ulong)indexA,uVar8 & 0xffffffff);
        *(long **)(CONCAT44(extraout_var_01,iVar20) + 8) = plVar23;
      }
      else {
        plVar23 = (long *)(pcVar22->field_2).m_userPointer;
      }
    }
    else {
      iVar20 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                         (this->m_dispatcher,&local_110,&local_138,0,2);
      plVar23 = (long *)CONCAT44(extraout_var,iVar20);
    }
    pcVar14 = this->m_resultOut;
    local_88 = pcVar14->m_body0Wrap;
    pcStack_80 = pcVar14->m_body1Wrap;
    pcVar14->m_body0Wrap = &local_110;
    pcVar14->m_body1Wrap = &local_138;
    (*(pcVar14->super_Result)._vptr_Result[2])(pcVar14,0xffffffff,(ulong)indexA);
    (*(this->m_resultOut->super_Result)._vptr_Result[3])
              (this->m_resultOut,0xffffffff,uVar8 & 0xffffffff);
    (**(code **)(*plVar23 + 0x10))
              (plVar23,&local_110,&local_138,this->m_dispatchInfo,this->m_resultOut);
    pcVar14 = this->m_resultOut;
    pcVar14->m_body0Wrap = local_88;
    pcVar14->m_body1Wrap = pcStack_80;
    if (0.0 < local_144) {
      (**(code **)*plVar23)(plVar23);
      (*this->m_dispatcher->_vptr_cbtDispatcher[0xf])(this->m_dispatcher,plVar23);
    }
  }
LAB_008bad89:
  CProfileSample::~CProfileSample(&local_169);
  return;
}

Assistant:

void Process(const cbtDbvtNode* leaf0, const cbtDbvtNode* leaf1)
	{
		BT_PROFILE("cbtCompoundCompoundLeafCallback::Process");
		m_numOverlapPairs++;

		int childIndex0 = leaf0->dataAsInt;
		int childIndex1 = leaf1->dataAsInt;

		cbtAssert(childIndex0 >= 0);
		cbtAssert(childIndex1 >= 0);

		const cbtCompoundShape* compoundShape0 = static_cast<const cbtCompoundShape*>(m_compound0ColObjWrap->getCollisionShape());
		cbtAssert(childIndex0 < compoundShape0->getNumChildShapes());

		const cbtCompoundShape* compoundShape1 = static_cast<const cbtCompoundShape*>(m_compound1ColObjWrap->getCollisionShape());
		cbtAssert(childIndex1 < compoundShape1->getNumChildShapes());

		const cbtCollisionShape* childShape0 = compoundShape0->getChildShape(childIndex0);
		const cbtCollisionShape* childShape1 = compoundShape1->getChildShape(childIndex1);

		//backup
		cbtTransform orgTrans0 = m_compound0ColObjWrap->getWorldTransform();
		const cbtTransform& childTrans0 = compoundShape0->getChildTransform(childIndex0);
		cbtTransform newChildWorldTrans0 = orgTrans0 * childTrans0;

		cbtTransform orgTrans1 = m_compound1ColObjWrap->getWorldTransform();
		const cbtTransform& childTrans1 = compoundShape1->getChildTransform(childIndex1);
		cbtTransform newChildWorldTrans1 = orgTrans1 * childTrans1;

		//perform an AABB check first
		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;
		childShape0->getAabb(newChildWorldTrans0, aabbMin0, aabbMax0);
		childShape1->getAabb(newChildWorldTrans1, aabbMin1, aabbMax1);

		cbtVector3 thresholdVec(m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold);

		aabbMin0 -= thresholdVec;
		aabbMax0 += thresholdVec;

		if (gCompoundCompoundChildShapePairCallback)
		{
			if (!gCompoundCompoundChildShapePairCallback(childShape0, childShape1))
				return;
		}

		if (TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
		{
			cbtCollisionObjectWrapper compoundWrap0(this->m_compound0ColObjWrap, childShape0, m_compound0ColObjWrap->getCollisionObject(), newChildWorldTrans0, -1, childIndex0);
			cbtCollisionObjectWrapper compoundWrap1(this->m_compound1ColObjWrap, childShape1, m_compound1ColObjWrap->getCollisionObject(), newChildWorldTrans1, -1, childIndex1);

			cbtSimplePair* pair = m_childCollisionAlgorithmCache->findPair(childIndex0, childIndex1);
			bool removePair = false;
			cbtCollisionAlgorithm* colAlgo = 0;
			if (m_resultOut->m_closestPointDistanceThreshold > 0)
			{
				colAlgo = m_dispatcher->findAlgorithm(&compoundWrap0, &compoundWrap1, 0, BT_CLOSEST_POINT_ALGORITHMS);
				removePair = true;
			}
			else
			{
				if (pair)
				{
					colAlgo = (cbtCollisionAlgorithm*)pair->m_userPointer;
				}
				else
				{
					colAlgo = m_dispatcher->findAlgorithm(&compoundWrap0, &compoundWrap1, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);
					pair = m_childCollisionAlgorithmCache->addOverlappingPair(childIndex0, childIndex1);
					cbtAssert(pair);
					pair->m_userPointer = colAlgo;
				}
			}

			cbtAssert(colAlgo);

			const cbtCollisionObjectWrapper* tmpWrap0 = 0;
			const cbtCollisionObjectWrapper* tmpWrap1 = 0;

			tmpWrap0 = m_resultOut->getBody0Wrap();
			tmpWrap1 = m_resultOut->getBody1Wrap();

			m_resultOut->setBody0Wrap(&compoundWrap0);
			m_resultOut->setBody1Wrap(&compoundWrap1);

			m_resultOut->setShapeIdentifiersA(-1, childIndex0);
			m_resultOut->setShapeIdentifiersB(-1, childIndex1);

			colAlgo->processCollision(&compoundWrap0, &compoundWrap1, m_dispatchInfo, m_resultOut);

			m_resultOut->setBody0Wrap(tmpWrap0);
			m_resultOut->setBody1Wrap(tmpWrap1);

			if (removePair)
			{
				colAlgo->~cbtCollisionAlgorithm();
				m_dispatcher->freeCollisionAlgorithm(colAlgo);
			}
		}
	}